

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O2

bool tcu::anon_unknown_0::comparePixelRGBA8
               (ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,RGBA threshold,
               int x,int y)

{
  RGBA a;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  void *pvVar5;
  bool bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint fx1;
  uint uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  uint fy1;
  int iVar21;
  ulong uVar22;
  
  uVar14 = (ulong)(uint)(x * 4);
  a.m_value = *(deUint32 *)((long)result->m_data + uVar14 + (uint)((result->m_pitch).m_data[1] * y))
  ;
  iVar19 = (reference->m_size).m_data[0] + -1;
  if (x + 1 < iVar19) {
    iVar19 = x + 1;
  }
  iVar12 = y + -1;
  if (y + -1 < 1) {
    iVar12 = 0;
  }
  iVar16 = (reference->m_size).m_data[1] + -1;
  if (y + 1 < iVar16) {
    iVar16 = y + 1;
  }
  bVar6 = compareThreshold(a,(RGBA)*(deUint32 *)
                                    ((long)reference->m_data +
                                    uVar14 + (uint)((reference->m_pitch).m_data[1] * y)),threshold);
  if (!bVar6) {
    iVar21 = 0;
    if (0 < x + -1) {
      iVar21 = x + -1;
    }
    uVar22 = (ulong)(uint)(iVar21 << 2);
    bVar6 = compareThreshold(a,(RGBA)*(deUint32 *)
                                      ((long)reference->m_data +
                                      uVar22 + (uint)((reference->m_pitch).m_data[1] * y)),threshold
                            );
    if (!bVar6) {
      uVar20 = (ulong)(uint)(iVar19 << 2);
      bVar6 = compareThreshold(a,(RGBA)*(deUint32 *)
                                        ((long)reference->m_data +
                                        uVar20 + (uint)((reference->m_pitch).m_data[1] * y)),
                               threshold);
      if (((((!bVar6) &&
            (bVar6 = compareThreshold(a,(RGBA)*(deUint32 *)
                                               ((long)reference->m_data +
                                               uVar22 + (uint)((reference->m_pitch).m_data[1] *
                                                              iVar12)),threshold), !bVar6)) &&
           (bVar6 = compareThreshold(a,(RGBA)*(deUint32 *)
                                              ((long)reference->m_data +
                                              uVar14 + (uint)((reference->m_pitch).m_data[1] *
                                                             iVar12)),threshold), !bVar6)) &&
          ((bVar6 = compareThreshold(a,(RGBA)*(deUint32 *)
                                              ((long)reference->m_data +
                                              uVar20 + (uint)(iVar12 * (reference->m_pitch).m_data
                                                                       [1])),threshold), !bVar6 &&
           (bVar6 = compareThreshold(a,(RGBA)*(deUint32 *)
                                              ((long)reference->m_data +
                                              uVar22 + (uint)((reference->m_pitch).m_data[1] *
                                                             iVar16)),threshold), !bVar6)))) &&
         (bVar6 = compareThreshold(a,(RGBA)*(deUint32 *)
                                            ((long)reference->m_data +
                                            uVar14 + (uint)((reference->m_pitch).m_data[1] * iVar16)
                                            ),threshold), !bVar6)) {
        bVar6 = compareThreshold(a,(RGBA)*(deUint32 *)
                                          ((long)reference->m_data +
                                          uVar20 + (uint)(iVar16 * (reference->m_pitch).m_data[1])),
                                 threshold);
        if (bVar6) {
          return true;
        }
        lVar18 = 0;
        do {
          bVar6 = lVar18 != 0x1c;
          if (!bVar6) {
            return bVar6;
          }
          uVar13 = x * 0x100 + -0x100 + comparePixelRGBA8::s_offsets[lVar18][0];
          if ((-1 < (int)uVar13) && ((int)uVar13 < (reference->m_size).m_data[0] * 0x100 + -0x100))
          {
            uVar15 = y * 0x100 + -0x100 + comparePixelRGBA8::s_offsets[lVar18][1];
            if ((-1 < (int)uVar15) && ((int)uVar15 < (reference->m_size).m_data[1] * 0x100 + -0x100)
               ) {
              fx1 = comparePixelRGBA8::s_offsets[lVar18][0] & 0xff;
              fy1 = comparePixelRGBA8::s_offsets[lVar18][1] & 0xff;
              pvVar5 = reference->m_data;
              iVar19 = (reference->m_pitch).m_data[1];
              uVar17 = iVar19 * (uVar15 >> 8);
              uVar14 = (ulong)(uVar13 >> 6 & 0x1fffffc);
              uVar1 = *(undefined4 *)((long)pvVar5 + uVar14 + uVar17);
              uVar2 = *(undefined4 *)((long)pvVar5 + uVar14 + 4 + (ulong)uVar17);
              uVar13 = ((uVar15 >> 8) + 1) * iVar19;
              uVar3 = *(undefined4 *)((long)pvVar5 + uVar14 + uVar13);
              uVar4 = *(undefined4 *)((long)pvVar5 + uVar14 + 4 + (ulong)uVar13);
              bVar7 = interpolateChannel(fx1,fy1,(deUint8)uVar1,(deUint8)uVar3,(deUint8)uVar2,
                                         (deUint8)uVar4);
              bVar8 = interpolateChannel(fx1,fy1,(deUint8)((uint)uVar1 >> 8),
                                         (deUint8)((uint)uVar3 >> 8),(deUint8)((uint)uVar2 >> 8),
                                         (deUint8)((uint)uVar4 >> 8));
              bVar9 = interpolateChannel(fx1,fy1,(deUint8)((uint)uVar1 >> 0x10),
                                         (deUint8)((uint)uVar3 >> 0x10),
                                         (deUint8)((uint)uVar2 >> 0x10),
                                         (deUint8)((uint)uVar4 >> 0x10));
              bVar10 = interpolateChannel(fx1,fy1,(deUint8)((uint)uVar1 >> 0x18),
                                          (deUint8)((uint)uVar3 >> 0x18),
                                          (deUint8)((uint)uVar2 >> 0x18),
                                          (deUint8)((uint)uVar4 >> 0x18));
              bVar11 = compareThreshold(a,(RGBA)((uint)bVar10 << 0x18 |
                                                (uint)bVar9 << 0x10 |
                                                (uint)bVar8 * 0x100 + (uint)bVar7),threshold);
              if (bVar11) {
                return bVar6;
              }
            }
          }
          lVar18 = lVar18 + 1;
        } while( true );
      }
    }
  }
  return true;
}

Assistant:

bool comparePixelRGBA8 (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const RGBA threshold, int x, int y)
{
	const RGBA resPix = readRGBA8(result, (deUint32)x, (deUint32)y);

	// Step 1: Compare result pixel to 3x3 neighborhood pixels in reference.
	{
		const deUint32	x0		= (deUint32)de::max(x-1, 0);
		const deUint32	x1		= (deUint32)x;
		const deUint32	x2		= (deUint32)de::min(x+1, reference.getWidth()-1);
		const deUint32	y0		= (deUint32)de::max(y-1, 0);
		const deUint32	y1		= (deUint32)y;
		const deUint32	y2		= (deUint32)de::min(y+1, reference.getHeight()-1);

		if (compareThreshold(resPix, readRGBA8(reference, x1, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y1), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x1, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y0), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x0, y2), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x1, y2), threshold) ||
			compareThreshold(resPix, readRGBA8(reference, x2, y2), threshold))
			return true;
	}

	// Step 2: Compare using bilinear sampling.
	{
		// \todo [pyry] Optimize sample positions!
		static const deUint32 s_offsets[][2] =
		{
			{ 226, 186 },
			{ 335, 235 },
			{ 279, 334 },
			{ 178, 272 },
			{ 112, 202 },
			{ 306, 117 },
			{ 396, 299 },
			{ 206, 382 },
			{ 146,  96 },
			{ 423, 155 },
			{ 361, 412 },
			{  84, 339 },
			{  48, 130 },
			{ 367,  43 },
			{ 455, 367 },
			{ 105, 439 },
			{  83,  46 },
			{ 217,  24 },
			{ 461,  71 },
			{ 450, 459 },
			{ 239, 469 },
			{  67, 267 },
			{ 459, 255 },
			{  13, 416 },
			{  10, 192 },
			{ 141, 502 },
			{ 503, 304 },
			{ 380, 506 }
		};

		for (int sampleNdx = 0; sampleNdx < DE_LENGTH_OF_ARRAY(s_offsets); sampleNdx++)
		{
			const int u = (x<<NUM_SUBPIXEL_BITS) + (int)s_offsets[sampleNdx][0] - (1<<NUM_SUBPIXEL_BITS);
			const int v = (y<<NUM_SUBPIXEL_BITS) + (int)s_offsets[sampleNdx][1] - (1<<NUM_SUBPIXEL_BITS);

			if (!de::inBounds(u, 0, (reference.getWidth()-1)<<NUM_SUBPIXEL_BITS) ||
				!de::inBounds(v, 0, (reference.getHeight()-1)<<NUM_SUBPIXEL_BITS))
				continue;

			if (compareThreshold(resPix, bilinearSampleRGBA8(reference, (deUint32)u, (deUint32)v), threshold))
				return true;
		}
	}

	return false;
}